

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.cc
# Opt level: O2

void __thiscall
mp::BasicProblem<mp::BasicProblemParams<int>_>::SetComplementarity
          (BasicProblem<mp::BasicProblemParams<int>_> *this,int con_index,int var_index,
          ComplInfo info)

{
  double *pdVar1;
  pointer puVar2;
  ulong uVar3;
  
  puVar2 = (this->compl_vars_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar3 = (ulong)con_index;
  if ((ulong)((long)(this->compl_vars_).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)puVar2 >> 2) <= uVar3) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
              (&this->compl_vars_,
               ((long)(this->algebraic_cons_).
                      super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
               (long)(this->algebraic_cons_).
                     super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x88);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&this->compl_vars_,
               ((long)(this->algebraic_cons_).
                      super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->algebraic_cons_).
                     super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x88);
    puVar2 = (this->compl_vars_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_start;
  }
  puVar2[uVar3] = var_index + 1;
  pdVar1 = &(this->algebraic_cons_).
            super__Vector_base<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo,_std::allocator<mp::BasicProblem<mp::BasicProblemParams<int>_>::AlgebraicConInfo>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar3].lb;
  *(undefined4 *)pdVar1 = 0;
  *(uint *)((long)pdVar1 + 4) = ~-(uint)((info.flags_ & 2U) == 0) & 0xfff00000;
  *(undefined4 *)(pdVar1 + 1) = 0;
  *(uint *)((long)pdVar1 + 0xc) = ~-(uint)((info.flags_ & 1U) == 0) & 0x7ff00000;
  return;
}

Assistant:

void BasicProblem<Alloc>::SetComplementarity(
    int con_index, int var_index, ComplInfo info) {
  MP_ASSERT(0 <= con_index && con_index < num_algebraic_cons(),
            "invalid index");
  MP_ASSERT(0 <= var_index && var_index < num_vars(), "invalid index");
  if (compl_vars_.size() <= static_cast<std::size_t>(con_index)) {
    compl_vars_.reserve(algebraic_cons_.capacity());
    compl_vars_.resize(algebraic_cons_.size());
  }
  compl_vars_[con_index] = var_index + 1u;
  AlgebraicConInfo &con = algebraic_cons_[con_index];
  con.lb = info.con_lb();
  con.ub = info.con_ub();
}